

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O1

float __thiscall Imath_3_2::Frustum<float>::aspectExc(Frustum<float> *this)

{
  domain_error *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = this->_right - this->_left;
  fVar2 = this->_top - this->_bottom;
  fVar3 = fVar2;
  if (fVar2 <= -fVar2) {
    fVar3 = -fVar2;
  }
  if (fVar3 < 1.0) {
    fVar4 = fVar1;
    if (fVar1 <= -fVar1) {
      fVar4 = -fVar1;
    }
    if (fVar3 * 3.4028235e+38 < fVar4) {
      this_00 = (domain_error *)__cxa_allocate_exception(0x10);
      std::domain_error::domain_error
                (this_00,"Bad viewing frustum: aspect ratio cannot be computed.");
      __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
  }
  return fVar1 / fVar2;
}

Assistant:

IMATH_CONSTEXPR14 inline T
Frustum<T>::aspectExc () const
{
    T rightMinusLeft = _right - _left;
    T topMinusBottom = _top - _bottom;

    if (abs (topMinusBottom) < T (1) &&
        abs (rightMinusLeft) >
            std::numeric_limits<T>::max () * abs (topMinusBottom))
    {
        throw std::domain_error ("Bad viewing frustum: "
                                 "aspect ratio cannot be computed.");
    }

    return rightMinusLeft / topMinusBottom;
}